

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

QString * __thiscall
QtMWidgets::Section::value(QString *__return_storage_ptr__,Section *this,QDateTime *dt)

{
  Type TVar1;
  int iVar2;
  bool bVar3;
  int local_8c;
  int hour;
  QLatin1String local_80;
  undefined4 local_6c;
  QLatin1String local_68;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_3c;
  undefined1 local_38 [8];
  QString v;
  QDateTime *dt_local;
  Section *this_local;
  
  v.d.size = (qsizetype)dt;
  QString::QString((QString *)local_38);
  TVar1 = this->type;
  if (TVar1 != AmPmSection) {
    if (TVar1 == SecondSection) {
      QDateTime::time();
      iVar2 = QTime::second();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (TVar1 == MinuteSection) {
      QDateTime::time();
      iVar2 = QTime::minute();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (TVar1 == Hour12Section) {
      QDateTime::time();
      local_8c = QTime::hour();
      if (local_8c < 0xd) {
        if (local_8c == 0) {
          local_8c = 0xc;
        }
      }
      else {
        local_8c = local_8c + -0xc;
      }
      makeSectionValue((QString *)local_38,local_8c,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (TVar1 == Hour24Section) {
      QDateTime::time();
      iVar2 = QTime::hour();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (((TVar1 == DaySection) || (TVar1 == DaySectionShort)) || (TVar1 == DaySectionLong)) {
      QDateTime::date();
      iVar2 = QDate::day();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (TVar1 == MonthSection) {
      QDateTime::date();
      iVar2 = QDate::month();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if ((TVar1 == MonthSectionShort) || (TVar1 == MonthSectionLong)) {
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (TVar1 == YearSection) {
      QDateTime::date();
      iVar2 = QDate::year();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    else if (TVar1 == YearSection2Digits) {
      QDateTime::date();
      iVar2 = QDate::year();
      makeSectionValue((QString *)local_38,iVar2,(bool)(this->zeroesAdded & 1));
      QString::right((longlong)__return_storage_ptr__);
    }
    else {
      QString::QString(__return_storage_ptr__,(QString *)local_38);
    }
    goto LAB_00201d8e;
  }
  local_3c = QDateTime::time();
  iVar2 = QTime::hour();
  if (iVar2 < 0xd) {
LAB_002018f5:
    local_54 = QDateTime::time();
    iVar2 = QTime::hour();
    bVar3 = iVar2 == 0;
  }
  else {
    local_50 = QDateTime::time();
    iVar2 = QTime::hour();
    bVar3 = true;
    if (0x17 < iVar2) goto LAB_002018f5;
  }
  if (bVar3) {
    QLatin1String::QLatin1String(&local_68,"PM");
    QString::QString(__return_storage_ptr__,local_68);
  }
  else {
    QLatin1String::QLatin1String(&local_80,"AM");
    QString::QString(__return_storage_ptr__,local_80);
  }
LAB_00201d8e:
  local_6c = 1;
  QString::~QString((QString *)local_38);
  return __return_storage_ptr__;
}

Assistant:

QString
Section::value( const QDateTime & dt ) const
{
	QString v;

	switch( type )
	{
		case AmPmSection :
			if( ( dt.time().hour() > 12 && dt.time().hour() <= 23 ) ||
				dt.time().hour() == 0 )
					return QLatin1String( "PM" );
			else
				return QLatin1String( "AM" );
		break;

		case SecondSection :
		{
			makeSectionValue( v, dt.time().second(), zeroesAdded );
			return v;
		}
		break;

		case MinuteSection :
		{
			makeSectionValue( v, dt.time().minute(), zeroesAdded );
			return v;
		}
		break;

		case Hour12Section :
		{
			int hour = dt.time().hour();

			if( hour > 12 )
				hour -= 12;
			else if( hour == 0 )
				hour = 12;

			makeSectionValue( v, hour, zeroesAdded );

			return v;
		}
		break;

		case Hour24Section :
		{
			makeSectionValue( v, dt.time().hour(), zeroesAdded );
			return v;
		}
		break;

		case DaySection :
		case DaySectionShort :
		case DaySectionLong :
		{
			makeSectionValue( v, dt.date().day(), zeroesAdded );
			return v;
		}
		break;

		case MonthSection :
		{
			makeSectionValue( v, dt.date().month(), zeroesAdded );
			return v;
		}
		break;

		case MonthSectionShort :
		case MonthSectionLong :
			return v;
		break;

		case YearSection :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v;
		}
		break;

		case YearSection2Digits :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v.right( 2 );
		}
		break;

		default :
			return v;
		break;
	}

	return v;
}